

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subcommands.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  pointer pcVar1;
  App *pAVar2;
  ostream *poVar3;
  pointer ppAVar4;
  string file;
  App app;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  App *local_3e0;
  char *local_3d8;
  long local_3d0;
  char local_3c8 [16];
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> local_3b8;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  App local_200;
  
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"K3Pi goofit fitter","");
  CLI::App::App(&local_200,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p);
  }
  local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"--random","");
  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"Some random flag","");
  CLI::App::add_flag(&local_200,&local_240,&local_260);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p);
  }
  local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"start","");
  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"A great subcommand","");
  pAVar2 = CLI::App::add_subcommand(&local_200,&local_280,&local_2a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p);
  }
  local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"stop","");
  local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2e0,"Do you really want to stop?","");
  local_3e0 = CLI::App::add_subcommand(&local_200,&local_2c0,&local_2e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p);
  }
  local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
  local_400._M_string_length = 0;
  local_400.field_2._M_local_buf[0] = '\0';
  local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"-f,--file","");
  local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"File name","");
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar2,&local_300,&local_400,&local_320);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != &local_320.field_2) {
    operator_delete(local_320._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != &local_300.field_2) {
    operator_delete(local_300._M_dataplus._M_p);
  }
  local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"-c,--count","");
  local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_360,"Counter","");
  CLI::App::add_flag(local_3e0,&local_340,&local_360);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != &local_340.field_2) {
    operator_delete(local_340._M_dataplus._M_p);
  }
  CLI::App::parse(&local_200,argc,argv);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Working on file: ",0x11)
  ;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_400._M_dataplus._M_p,local_400._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", direct count: ",0x10);
  local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,"--file","");
  CLI::App::count(pAVar2,&local_380);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != &local_380.field_2) {
    operator_delete(local_380._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Working on count: ",0x12);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", direct count: ",0x10);
  local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a0,"--count","");
  CLI::App::count(local_3e0,&local_3a0);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
    operator_delete(local_3a0._M_dataplus._M_p);
  }
  CLI::std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::vector
            (&local_3b8,&local_200.parsed_subcommands_);
  if (local_3b8.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_3b8.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ppAVar4 = local_3b8.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      pAVar2 = *ppAVar4;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Subcommand:",0xb);
      pcVar1 = (pAVar2->name_)._M_dataplus._M_p;
      local_3d8 = local_3c8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_3d8,pcVar1,pcVar1 + (pAVar2->name_)._M_string_length);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_3d8,local_3d0);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      if (local_3d8 != local_3c8) {
        operator_delete(local_3d8);
      }
      ppAVar4 = ppAVar4 + 1;
    } while (ppAVar4 !=
             local_3b8.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if (local_3b8.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3b8.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_400._M_dataplus._M_p != &local_400.field_2) {
    operator_delete(local_400._M_dataplus._M_p);
  }
  CLI::App::~App(&local_200);
  return 0;
}

Assistant:

int main(int argc, char **argv) {

    CLI::App app("K3Pi goofit fitter");
    app.add_flag("--random", "Some random flag");
    CLI::App *start = app.add_subcommand("start", "A great subcommand");
    CLI::App *stop = app.add_subcommand("stop", "Do you really want to stop?");

    std::string file;
    start->add_option("-f,--file", file, "File name");

    CLI::Option *s = stop->add_flag("-c,--count", "Counter");

    CLI11_PARSE(app, argc, argv);

    std::cout << "Working on file: " << file << ", direct count: " << start->count("--file") << std::endl;
    std::cout << "Working on count: " << s->count() << ", direct count: " << stop->count("--count") << std::endl;
    for(auto subcom : app.get_subcommands())
        std::cout << "Subcommand:" << subcom->get_name() << std::endl;

    return 0;
}